

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreciseDeltaTests.cpp
# Opt level: O0

void __thiscall agge::tests::PreciseDeltaTests::ExtremeMinRatioSupported1(PreciseDeltaTests *this)

{
  int iVar1;
  allocator local_f1;
  string local_f0 [32];
  LocationInfo local_d0;
  int local_a8;
  int i_1;
  allocator local_91;
  string local_90 [32];
  LocationInfo local_70;
  int local_48;
  int local_44;
  int i;
  int sum;
  precise_delta d;
  PreciseDeltaTests *this_local;
  int m;
  int exp;
  int iq;
  anon_union_4_2_0ec0eecc u;
  
  i = 0;
  d._quotient = 0x1e;
  sum = 0x40;
  local_44 = 0;
  d._8_8_ = this;
  precise_delta::multiply((precise_delta *)&i,0x89);
  for (local_48 = 0x1000000; iVar1 = local_44, local_48 != 0; local_48 = local_48 + -1) {
    iVar1 = precise_delta::next((precise_delta *)&i);
    local_44 = iVar1 + local_44;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PreciseDeltaTests.cpp"
             ,&local_91);
  ut::LocationInfo::LocationInfo(&local_70,(string *)local_90,0xea);
  ut::are_equal(0x89,iVar1,&local_70);
  ut::LocationInfo::~LocationInfo(&local_70);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  local_44 = 0;
  precise_delta::multiply((precise_delta *)&i,-0x13);
  for (local_a8 = 0x1000000; iVar1 = local_44, local_a8 != 0; local_a8 = local_a8 + -1) {
    iVar1 = precise_delta::next((precise_delta *)&i);
    local_44 = iVar1 + local_44;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PreciseDeltaTests.cpp"
             ,&local_f1);
  ut::LocationInfo::LocationInfo(&local_d0,(string *)local_f0,0xf5);
  ut::are_equal(-0x13,iVar1,&local_d0);
  ut::LocationInfo::~LocationInfo(&local_d0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  return;
}

Assistant:

test( ExtremeMinRatioSupported1 )
			{
				// INIT
				precise_delta d(1, 0xFFFFFF);
				int sum = 0;

				// ACT
				d.multiply(137);
				for (int i = 0x1000000; i; --i)
					sum += d.next();

				// ASSERT
				assert_equal(137, sum);

				// INIT
				sum = 0;

				// ACT
				d.multiply(-19);
				for (int i = 0x1000000; i; --i)
					sum += d.next();

				// ASSERT
				assert_equal(-19, sum);
			}